

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::enteringExecMode(TimeCoordinator *this,IterationRequest mode)

{
  BaseType data;
  DependencyInfo *pDVar1;
  undefined1 in_SIL;
  long in_RDI;
  DependencyInfo *mfed;
  ActionMessage execreq;
  ActionMessage ge;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  IterationRequest iterate;
  ActionMessage *in_stack_fffffffffffffe10;
  GlobalFederateId in_stack_fffffffffffffe2c;
  GlobalFederateId in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  SmallBuffer *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  GlobalFederateId in_stack_fffffffffffffe48;
  GlobalFederateId GVar2;
  InterfaceHandle in_stack_fffffffffffffe4c;
  GlobalFederateId in_stack_fffffffffffffe54;
  ConnectionType in_stack_fffffffffffffe67;
  Time in_stack_fffffffffffffe68;
  GlobalFederateId in_stack_fffffffffffffe70;
  GlobalFederateId in_stack_fffffffffffffe74;
  GlobalFederateId in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_38;
  
  if ((*(byte *)(in_RDI + 0x53) & 1) == 0) {
    *(undefined1 *)(in_RDI + 0x259) = in_SIL;
    TimeDependencies::checkForIssues_abi_cxx11_
              ((TimeDependencies *)
               CONCAT44(in_stack_fffffffffffffe4c.hid,in_stack_fffffffffffffe48.gid),
               (bool)in_stack_fffffffffffffe47);
    if (local_38 == 0) {
      BaseTimeCoordinator::sendTimingInfo
                ((BaseTimeCoordinator *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00.gid));
      iterate = (IterationRequest)((uint)in_stack_fffffffffffffe0c >> 0x18);
      *(undefined1 *)(in_RDI + 0x52) = 1;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.gid),
                 in_stack_fffffffffffffe2c.gid);
      GVar2.gid = *(BaseType *)(in_RDI + 0x48);
      if (*(char *)(in_RDI + 0x259) != '\0') {
        setIterationFlags(in_stack_fffffffffffffe10,iterate);
        *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
        if ((*(byte *)(in_RDI + 0x25a) & 1) == 0) {
          in_stack_fffffffffffffe10 = (ActionMessage *)(in_RDI + 8);
          GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffe30);
          pDVar1 = getExecEntryMinFederate
                             ((TimeDependencies *)in_stack_fffffffffffffe68.internalTimeCode,
                              in_stack_fffffffffffffe74,in_stack_fffffffffffffe67,
                              in_stack_fffffffffffffe70);
          data = GlobalFederateId::baseValue(&pDVar1->fedID);
          ActionMessage::setExtraData(in_stack_fffffffffffffe10,data);
        }
      }
      if ((*(byte *)(in_RDI + 0x250) & 1) != 0) {
        setActionFlag<helics::ActionMessage,helics::TimingFlags>
                  ((ActionMessage *)&stack0xfffffffffffffe40,delayed_timing_flag);
      }
      GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffe2c);
      transmitTimingMessages
                ((TimeCoordinator *)CONCAT44(in_stack_fffffffffffffe4c.hid,GVar2.gid),
                 (ActionMessage *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe54);
      ActionMessage::~ActionMessage(in_stack_fffffffffffffe10);
    }
    else {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.gid),
                 in_stack_fffffffffffffe2c.gid);
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xffffffffffffff00,(GlobalBrokerId)0x0);
      SmallBuffer::operator=
                (in_stack_fffffffffffffe38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30.gid));
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffe10,
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      ActionMessage::~ActionMessage(in_stack_fffffffffffffe10);
    }
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x54d597);
  }
  return;
}

Assistant:

void TimeCoordinator::enteringExecMode(IterationRequest mode)
{
    if (executionMode) {
        return;
    }
    iterating = mode;
    auto res = dependencies.checkForIssues(info.wait_for_current_time_updates);
    if (res.first != 0) {
        ActionMessage ge(CMD_GLOBAL_ERROR);
        ge.dest_id = parent_broker_id;
        ge.source_id = mSourceId;
        ge.messageID = res.first;
        ge.payload = res.second;
        sendMessageFunction(ge);
        return;
    }
    sendTimingInfo();
    checkingExec = true;
    ActionMessage execreq(CMD_EXEC_REQUEST);

    execreq.source_id = mSourceId;
    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(execreq, iterating);
        ++sequenceCounter;
        execreq.counter = sequenceCounter;
        if (!hasInitUpdates) {
            const auto& mfed = getExecEntryMinFederate(dependencies, mSourceId);
            execreq.setExtraData(mfed.fedID.baseValue());
        }
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(execreq, delayed_timing_flag);
    }
    transmitTimingMessages(execreq);
}